

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O0

double rlog(double *x)

{
  double dVar1;
  double dVar2;
  double *x_local;
  
  if ((*x <= 0.61 && *x != 0.61) || (1.57 < *x)) {
    dVar1 = (*x - 0.5) - 0.5;
    rlog::r = dVar1;
    dVar2 = log(*x);
    x_local = (double *)(dVar1 - dVar2);
  }
  else {
    if (0.82 < *x || *x == 0.82) {
      if (*x <= 1.18) {
        rlog::u = (*x - 0.5) - 0.5;
        rlog::w1 = 0.0;
      }
      else {
        rlog::u = *x * 0.75 + -1.0;
        rlog::w1 = rlog::b + rlog::u / 3.0;
      }
    }
    else {
      rlog::u = (*x - 0.7) / 0.7;
      rlog::w1 = -rlog::u * 0.3 + rlog::a;
    }
    rlog::r = rlog::u / (rlog::u + 2.0);
    rlog::t = rlog::r * rlog::r;
    rlog::w = ((rlog::p2 * rlog::t + rlog::p1) * rlog::t + rlog::p0) /
              ((rlog::q2 * rlog::t + rlog::q1) * rlog::t + 1.0);
    x_local = (double *)(rlog::t * 2.0 * (-rlog::r * rlog::w + 1.0 / (1.0 - rlog::r)) + rlog::w1);
  }
  rlog::rlog = (double)x_local;
  return (double)x_local;
}

Assistant:

double rlog ( double *x )

//****************************************************************************80
//
//  Purpose:
//
//    RLOG computes  X - 1 - LN(X).
//
//  Modified:
//
//    09 December 1999
//
//  Parameters:
//
//    Input, double *X, the argument of the function.
//
//    Output, double RLOG, the value of the function.
//
{
  static double a = .566749439387324e-01;
  static double b = .456512608815524e-01;
  static double p0 = .333333333333333e+00;
  static double p1 = -.224696413112536e+00;
  static double p2 = .620886815375787e-02;
  static double q1 = -.127408923933623e+01;
  static double q2 = .354508718369557e+00;
  static double rlog,r,t,u,w,w1;

    if(*x < 0.61e0 || *x > 1.57e0) goto S40;
    if(*x < 0.82e0) goto S10;
    if(*x > 1.18e0) goto S20;
//
//              ARGUMENT REDUCTION
//
    u = *x-0.5e0-0.5e0;
    w1 = 0.0e0;
    goto S30;
S10:
    u = *x-0.7e0;
    u /= 0.7e0;
    w1 = a-u*0.3e0;
    goto S30;
S20:
    u = 0.75e0**x-1.e0;
    w1 = b+u/3.0e0;
S30:
//
//               SERIES EXPANSION
//
    r = u/(u+2.0e0);
    t = r*r;
    w = ((p2*t+p1)*t+p0)/((q2*t+q1)*t+1.0e0);
    rlog = 2.0e0*t*(1.0e0/(1.0e0-r)-r*w)+w1;
    return rlog;
S40:
    r = *x-0.5e0-0.5e0;
    rlog = r-log(*x);
    return rlog;
}